

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O2

void google::glog_internal_namespace_::ShutdownGoogleLoggingUtilities(void)

{
  ostream *poVar1;
  LogMessage local_20;
  
  if (g_program_invocation_short_name != 0) {
    g_program_invocation_short_name = 0;
    closelog();
    return;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/utilities.cc"
             ,0x17b);
  poVar1 = LogMessage::stream(&local_20);
  poVar1 = std::operator<<(poVar1,"Check failed: IsGoogleLoggingInitialized() ");
  std::operator<<(poVar1,
                  "You called ShutdownGoogleLogging() without calling InitGoogleLogging() first!");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

void ShutdownGoogleLoggingUtilities() {
  CHECK(IsGoogleLoggingInitialized())
      << "You called ShutdownGoogleLogging() without calling InitGoogleLogging() first!";
  g_program_invocation_short_name = NULL;
#ifdef HAVE_SYSLOG_H
  closelog();
#endif
}